

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  pointer *ppbVar1;
  pointer pbVar2;
  InternalRunDeathTestFlag *pIVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  undefined8 *puVar7;
  int *piVar8;
  void *__addr;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  undefined8 *extraout_RAX_02;
  undefined8 *extraout_RAX_03;
  undefined8 *extraout_RAX_04;
  undefined8 *extraout_RAX_05;
  undefined8 *extraout_RAX_06;
  undefined8 extraout_RAX_07;
  pointer *pppcVar9;
  __sighandler_t p_Var10;
  long *plVar11;
  _func_void *p_Var12;
  ulong *puVar13;
  ulong *puVar14;
  size_type *psVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  ulong *extraout_RDX_00;
  ulong *extraout_RDX_01;
  ulong *extraout_RDX_02;
  ulong *extraout_RDX_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_04;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_05;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_06;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long lVar17;
  ulong uVar18;
  pointer pbVar19;
  pointer ppcVar20;
  ulong uVar21;
  undefined8 uVar22;
  const_iterator __position;
  size_t __len;
  _union_1457 local_310;
  sigaction ignore_sigprof_action;
  string filter_flag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  string local_1c0;
  size_type *local_1a0;
  string internal_flag;
  ExecDeathTestArgs args_2;
  int local_15c;
  undefined1 auStack_158 [4];
  int death_test_index;
  Arguments args;
  int local_138;
  int local_134;
  int pipe_fd [2];
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60;
  long lStack_58;
  pointer *local_50;
  long local_48;
  pointer local_40;
  long lStack_38;
  
  UnitTest::GetInstance();
  pIVar3 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  local_15c = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).
              death_test_count_;
  if (pIVar3 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar3->write_fd_;
    return EXECUTE_TEST;
  }
  iVar4 = pipe(&local_138);
  if (iVar4 == -1) {
    local_70 = &local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CHECK failed: File ","");
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
    local_50 = (pointer *)*puVar7;
    pppcVar9 = (pointer *)(puVar7 + 2);
    if (local_50 == pppcVar9) {
      local_40 = *pppcVar9;
      lStack_38 = puVar7[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *pppcVar9;
    }
    local_48 = puVar7[1];
    *puVar7 = pppcVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (ulong *)*plVar6;
    puVar14 = (ulong *)(plVar6 + 2);
    if (local_90 == puVar14) {
      local_80 = *puVar14;
      lStack_78 = plVar6[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *puVar14;
    }
    local_88 = plVar6[1];
    *plVar6 = (long)puVar14;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_f0._M_dataplus._M_p._0_4_ = 0x589;
    StreamableToString<int>(&local_d0,(int *)&local_f0);
    uVar21 = 0xf;
    if (local_90 != &local_80) {
      uVar21 = local_80;
    }
    if (uVar21 < local_d0._M_string_length + local_88) {
      uVar22 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        uVar22 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar22 < local_d0._M_string_length + local_88) goto LAB_00125142;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_90);
    }
    else {
LAB_00125142:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_d0._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pointer)*puVar7;
    puVar14 = puVar7 + 2;
    if ((ulong *)local_b0._M_dataplus._M_p == puVar14) {
      local_b0.field_2._M_allocated_capacity = *puVar14;
      local_b0.field_2._8_8_ = puVar7[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *puVar14;
    }
    local_b0._M_string_length = puVar7[1];
    *puVar7 = puVar14;
    puVar7[1] = 0;
    *(undefined1 *)puVar14 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_310.sa_handler = (__sighandler_t)*plVar6;
    p_Var10 = (__sighandler_t)(plVar6 + 2);
    if (local_310.sa_handler == p_Var10) {
      ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var10;
      ignore_sigprof_action.sa_mask.__val[1] = plVar6[3];
      local_310 = (_union_1457)&ignore_sigprof_action.sa_mask;
    }
    else {
      ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var10;
    }
    ignore_sigprof_action.__sigaction_handler =
         *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar6 + 1);
    *plVar6 = (long)p_Var10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
    filter_flag.field_2._8_8_ = *puVar7;
    puVar14 = puVar7 + 2;
    if ((ulong *)filter_flag.field_2._8_8_ == puVar14) {
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar14;
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar7[3];
      filter_flag.field_2._8_8_ =
           &args_1.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar14;
    }
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar7[1];
    *puVar7 = puVar14;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    DeathTestAbort((string *)((long)&filter_flag.field_2 + 8));
    puVar7 = extraout_RAX_02;
    filter_flag.field_2._8_8_ = extraout_RDX_02;
LAB_00125b29:
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar14;
  }
  else {
    iVar4 = fcntl(local_134,2,0);
    if (iVar4 != -1) {
      local_70 = &local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"--","");
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
      pppcVar9 = (pointer *)(plVar6 + 2);
      if ((pointer *)*plVar6 == pppcVar9) {
        local_40 = *pppcVar9;
        lStack_38 = plVar6[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *pppcVar9;
        local_50 = (pointer *)*plVar6;
      }
      local_48 = plVar6[1];
      *plVar6 = (long)pppcVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_90 = &local_80;
      puVar14 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar14) {
        local_80 = *puVar14;
        lStack_78 = plVar6[3];
      }
      else {
        local_80 = *puVar14;
        local_90 = (ulong *)*plVar6;
      }
      local_88 = plVar6[1];
      *plVar6 = (long)puVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      psVar15 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar15) {
        local_b0.field_2._M_allocated_capacity = *psVar15;
        local_b0.field_2._8_8_ = plVar6[3];
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar15;
        local_b0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_b0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar15;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_310.sa_handler = (__sighandler_t)&ignore_sigprof_action.sa_mask;
      p_Var10 = (__sighandler_t)(plVar6 + 2);
      if ((__sighandler_t)*plVar6 == p_Var10) {
        ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var10;
        ignore_sigprof_action.sa_mask.__val[1] = plVar6[3];
      }
      else {
        ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var10;
        local_310.sa_handler = (__sighandler_t)*plVar6;
      }
      ignore_sigprof_action.__sigaction_handler =
           *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar6 + 1);
      *plVar6 = (long)p_Var10;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_310);
      ppbVar1 = &args_1.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      plVar11 = plVar6 + 2;
      if ((long *)*plVar6 == plVar11) {
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar11;
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)plVar6[3];
        filter_flag.field_2._8_8_ = ppbVar1;
      }
      else {
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar11;
        filter_flag.field_2._8_8_ = (long *)*plVar6;
      }
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar6[1];
      *plVar6 = (long)plVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append(filter_flag.field_2._M_local_buf + 8);
      ignore_sigprof_action.sa_restorer = (_func_void *)&filter_flag._M_string_length;
      p_Var12 = (_func_void *)(plVar6 + 2);
      if ((_func_void *)*plVar6 == p_Var12) {
        filter_flag._M_string_length = *(size_type *)p_Var12;
        filter_flag.field_2._M_allocated_capacity = plVar6[3];
      }
      else {
        filter_flag._M_string_length = *(size_type *)p_Var12;
        ignore_sigprof_action.sa_restorer = (_func_void *)*plVar6;
      }
      filter_flag._M_dataplus._M_p = (pointer)plVar6[1];
      *plVar6 = (long)p_Var12;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      if ((pointer *)filter_flag.field_2._8_8_ != ppbVar1) {
        operator_delete((void *)filter_flag.field_2._8_8_,
                        (ulong)((long)&((args_1.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                       _M_p + 1));
      }
      if ((__sigset_t *)local_310.sa_handler != &ignore_sigprof_action.sa_mask) {
        operator_delete(local_310.sa_handler,ignore_sigprof_action.sa_mask.__val[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50,(long)local_40 + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      pipe_fd = (int  [2])&local_120;
      std::__cxx11::string::_M_construct<char_const*>((string *)pipe_fd,"--","");
      plVar6 = (long *)std::__cxx11::string::append((char *)pipe_fd);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      puVar14 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_110.field_2._M_allocated_capacity = *puVar14;
        local_110.field_2._8_8_ = plVar6[3];
      }
      else {
        local_110.field_2._M_allocated_capacity = *puVar14;
        local_110._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_110._M_string_length = plVar6[1];
      *plVar6 = (long)puVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_110);
      plVar11 = plVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar11) {
        local_f0.field_2._M_allocated_capacity = *plVar11;
        local_f0.field_2._8_8_ = plVar6[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *plVar11;
        local_f0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_f0._M_string_length = plVar6[1];
      *plVar6 = (long)plVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_f0);
      puVar14 = (ulong *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_d0.field_2._M_allocated_capacity = *puVar14;
        local_d0.field_2._8_8_ = plVar6[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *puVar14;
        local_d0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_d0._M_string_length = plVar6[1];
      *plVar6 = (long)puVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_d0);
      puVar14 = (ulong *)(plVar6 + 2);
      if ((ulong *)*plVar6 == puVar14) {
        local_60 = *puVar14;
        lStack_58 = plVar6[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *puVar14;
        local_70 = (ulong *)*plVar6;
      }
      local_68 = plVar6[1];
      *plVar6 = (long)puVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_50 = &local_40;
      pppcVar9 = (pointer *)(plVar6 + 2);
      if ((pointer *)*plVar6 == pppcVar9) {
        local_40 = *pppcVar9;
        lStack_38 = plVar6[3];
      }
      else {
        local_40 = *pppcVar9;
        local_50 = (pointer *)*plVar6;
      }
      local_48 = plVar6[1];
      *plVar6 = (long)pppcVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      StreamableToString<int>((string *)auStack_158,&this->line_);
      ppcVar20 = (pointer)0xf;
      if (local_50 != &local_40) {
        ppcVar20 = local_40;
      }
      if (ppcVar20 <
          (pointer)((long)args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_start + local_48)) {
        ppcVar20 = (pointer)0xf;
        if ((pointer *)_auStack_158 !=
            &args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_finish) {
          ppcVar20 = args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        }
        if (ppcVar20 <
            (pointer)((long)args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_start + local_48)) goto LAB_00123d48;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)auStack_158,0,(char *)0x0,(ulong)local_50);
      }
      else {
LAB_00123d48:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_50,(ulong)_auStack_158);
      }
      local_90 = &local_80;
      puVar14 = puVar7 + 2;
      if ((ulong *)*puVar7 == puVar14) {
        local_80 = *puVar14;
        lStack_78 = puVar7[3];
      }
      else {
        local_80 = *puVar14;
        local_90 = (ulong *)*puVar7;
      }
      local_88 = puVar7[1];
      *puVar7 = puVar14;
      puVar7[1] = 0;
      *(undefined1 *)puVar14 = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      puVar14 = puVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_b0.field_2._M_allocated_capacity = *puVar14;
        local_b0.field_2._8_8_ = puVar7[3];
      }
      else {
        local_b0.field_2._M_allocated_capacity = *puVar14;
        local_b0._M_dataplus._M_p = (pointer)*puVar7;
      }
      local_b0._M_string_length = puVar7[1];
      *puVar7 = puVar14;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      StreamableToString<int>((string *)((long)&internal_flag.field_2 + 8),&local_15c);
      uVar21 = CONCAT44(args_2.argv._4_4_,(int)args_2.argv) + local_b0._M_string_length;
      uVar22 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        uVar22 = local_b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar22 < uVar21) {
        uVar18 = 0xf;
        if ((int *)internal_flag.field_2._8_8_ != &args_2.close_fd) {
          uVar18 = args_2._8_8_;
        }
        if (uVar18 < uVar21) goto LAB_00123e7c;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)((long)&internal_flag.field_2 + 8),0,(char *)0x0,
                            (ulong)local_b0._M_dataplus._M_p);
      }
      else {
LAB_00123e7c:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_b0,internal_flag.field_2._8_8_);
      }
      local_310.sa_handler = (__sighandler_t)&ignore_sigprof_action.sa_mask;
      p_Var10 = (__sighandler_t)(puVar7 + 2);
      if ((__sighandler_t)*puVar7 == p_Var10) {
        ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var10;
        ignore_sigprof_action.sa_mask.__val[1] = puVar7[3];
      }
      else {
        ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var10;
        local_310.sa_handler = (__sighandler_t)*puVar7;
      }
      ignore_sigprof_action.__sigaction_handler =
           *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(puVar7 + 1);
      *puVar7 = p_Var10;
      puVar7[1] = 0;
      *p_Var10 = (__sighandler_t)0x0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_310);
      plVar11 = plVar6 + 2;
      if ((long *)*plVar6 == plVar11) {
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar11;
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)plVar6[3];
        filter_flag.field_2._8_8_ = ppbVar1;
      }
      else {
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar11;
        filter_flag.field_2._8_8_ = (long *)*plVar6;
      }
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar6[1];
      *plVar6 = (long)plVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      StreamableToString<int>(&local_1c0,&local_134);
      pbVar2 = (pointer)((long)&((args_1.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        local_1c0._M_string_length);
      pbVar19 = (pointer)0xf;
      if ((pointer *)filter_flag.field_2._8_8_ != ppbVar1) {
        pbVar19 = args_1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      if (pbVar19 < pbVar2) {
        uVar22 = (pointer)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_1c0._M_dataplus._M_p._4_4_,local_1c0._M_dataplus._M_p._0_4_) !=
            &local_1c0.field_2) {
          uVar22 = local_1c0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar22 < pbVar2) goto LAB_00123fb0;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_1c0,0,(char *)0x0,filter_flag.field_2._8_8_);
      }
      else {
LAB_00123fb0:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           (filter_flag.field_2._M_local_buf + 8,
                            (ulong)CONCAT44(local_1c0._M_dataplus._M_p._4_4_,
                                            local_1c0._M_dataplus._M_p._0_4_));
      }
      local_1a0 = &internal_flag._M_string_length;
      psVar15 = puVar7 + 2;
      if ((size_type *)*puVar7 == psVar15) {
        internal_flag._M_string_length = *psVar15;
        internal_flag.field_2._M_allocated_capacity = puVar7[3];
      }
      else {
        internal_flag._M_string_length = *psVar15;
        local_1a0 = (size_type *)*puVar7;
      }
      internal_flag._M_dataplus._M_p = (pointer)puVar7[1];
      *puVar7 = psVar15;
      puVar7[1] = 0;
      *(undefined1 *)psVar15 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1c0._M_dataplus._M_p._4_4_,local_1c0._M_dataplus._M_p._0_4_) !=
          &local_1c0.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1c0._M_dataplus._M_p._4_4_,local_1c0._M_dataplus._M_p._0_4_),
                        (ulong)(local_1c0.field_2._M_allocated_capacity + 1));
      }
      if ((pointer *)filter_flag.field_2._8_8_ != ppbVar1) {
        operator_delete((void *)filter_flag.field_2._8_8_,
                        (ulong)((long)&((args_1.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                       _M_p + 1));
      }
      if ((__sigset_t *)local_310.sa_handler != &ignore_sigprof_action.sa_mask) {
        operator_delete(local_310.sa_handler,ignore_sigprof_action.sa_mask.__val[0] + 1);
      }
      if ((int *)internal_flag.field_2._8_8_ != &args_2.close_fd) {
        operator_delete((void *)internal_flag.field_2._8_8_,args_2._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if ((pointer *)_auStack_158 !=
          &args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_finish) {
        operator_delete(_auStack_158,
                        (long)args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl
                              .super__Vector_impl_data._M_finish + 1);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50,(long)local_40 + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if (pipe_fd != (int  [2])&local_120) {
        operator_delete((void *)pipe_fd,local_120._M_allocated_capacity + 1);
      }
      Arguments::Arguments((Arguments *)auStack_158);
      __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&g_argvs_abi_cxx11_;
      if (g_injected_test_argvs_abi_cxx11_ !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        __x = g_injected_test_argvs_abi_cxx11_;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&filter_flag.field_2 + 8),__x);
      Arguments::AddArguments<std::__cxx11::string>
                ((Arguments *)auStack_158,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&filter_flag.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&filter_flag.field_2 + 8));
      __position._M_current =
           args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_start + -1;
      filter_flag.field_2._8_8_ = strdup((char *)ignore_sigprof_action.sa_restorer);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)auStack_158,__position,
                 (value_type *)((long)&filter_flag.field_2 + 8));
      filter_flag.field_2._8_8_ = strdup((char *)local_1a0);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)auStack_158,
                 (const_iterator)
                 (args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                  super__Vector_impl_data._M_start + -1),
                 (value_type *)((long)&filter_flag.field_2 + 8));
      filter_flag.field_2._8_8_ = ppbVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)((long)&filter_flag.field_2 + 8),"")
      ;
      std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
      if ((pointer *)filter_flag.field_2._8_8_ != ppbVar1) {
        operator_delete((void *)filter_flag.field_2._8_8_,
                        (ulong)((long)&((args_1.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                       _M_p + 1));
      }
      CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
      fflush((FILE *)0x0);
      internal_flag.field_2._8_8_ = _auStack_158;
      args_2.argv._0_4_ = local_138;
      memset(&local_310,0,0x98);
      sigemptyset((sigset_t *)&ignore_sigprof_action);
      local_310 = (_union_1457)0x1;
      do {
        iVar4 = sigaction(0x1b,(sigaction *)&local_310,(sigaction *)((long)&filter_flag.field_2 + 8)
                         );
        if (iVar4 != -1) {
          if (FLAGS_gtest_death_test_use_fork != '\0') {
            iVar4 = fork();
            if (iVar4 == 0) {
              ExecDeathTestChildMain((void *)((long)&internal_flag.field_2 + 8));
              goto LAB_00124a27;
            }
LAB_00124446:
            goto LAB_0012444d;
          }
          if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
LAB_00124a27:
            AssumeRole();
          }
          iVar4 = getpagesize();
          __len = (size_t)(iVar4 * 2);
          __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
          if (__addr == (void *)0xffffffffffffffff) {
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f0,"CHECK failed: File ","");
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
            local_d0._M_dataplus._M_p = (pointer)*puVar7;
            puVar14 = puVar7 + 2;
            if ((ulong *)local_d0._M_dataplus._M_p == puVar14) {
              local_d0.field_2._M_allocated_capacity = *puVar14;
              local_d0.field_2._8_8_ = puVar7[3];
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            }
            else {
              local_d0.field_2._M_allocated_capacity = *puVar14;
            }
            local_d0._M_string_length = puVar7[1];
            *puVar7 = puVar14;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
            local_70 = &local_60;
            puVar14 = (ulong *)*puVar7;
            puVar13 = puVar7 + 2;
            if (puVar14 != puVar13) goto LAB_00125459;
            local_60 = *puVar13;
            lStack_58 = puVar7[3];
            goto LAB_00125464;
          }
          lVar17 = 0;
          if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
            lVar17 = __len - 0x40;
          }
          if (((uint)(iVar4 * 2) < 0x41) || (((ulong)(lVar17 + (long)__addr) & 0x3f) != 0)) {
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_f0,"CHECK failed: File ","");
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
            local_d0._M_dataplus._M_p = (pointer)*puVar7;
            puVar14 = puVar7 + 2;
            if ((ulong *)local_d0._M_dataplus._M_p == puVar14) {
              local_d0.field_2._M_allocated_capacity = *puVar14;
              local_d0.field_2._8_8_ = puVar7[3];
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            }
            else {
              local_d0.field_2._M_allocated_capacity = *puVar14;
            }
            local_d0._M_string_length = puVar7[1];
            *puVar7 = puVar14;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
            local_70 = (ulong *)*puVar7;
            puVar14 = puVar7 + 2;
            if (local_70 == puVar14) {
              local_60 = *puVar14;
              lStack_58 = puVar7[3];
              local_70 = &local_60;
            }
            else {
              local_60 = *puVar14;
            }
            local_68 = puVar7[1];
            *puVar7 = puVar14;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            pipe_fd[0] = 0x560;
            StreamableToString<int>(&local_110,pipe_fd);
            uVar21 = 0xf;
            if (local_70 != &local_60) {
              uVar21 = local_60;
            }
            if (uVar21 < local_110._M_string_length + local_68) {
              uVar22 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_110._M_dataplus._M_p != &local_110.field_2) {
                uVar22 = local_110.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar22 < local_110._M_string_length + local_68) goto LAB_00125581;
              puVar7 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_110,0,(char *)0x0,(ulong)local_70);
            }
            else {
LAB_00125581:
              puVar7 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_70,(ulong)local_110._M_dataplus._M_p);
            }
            local_50 = (pointer *)*puVar7;
            pppcVar9 = (pointer *)(puVar7 + 2);
            if (local_50 == pppcVar9) {
              local_40 = *pppcVar9;
              lStack_38 = puVar7[3];
              local_50 = &local_40;
            }
            else {
              local_40 = *pppcVar9;
            }
            local_48 = puVar7[1];
            *puVar7 = pppcVar9;
            puVar7[1] = 0;
            *(undefined1 *)pppcVar9 = 0;
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
            local_90 = (ulong *)*puVar7;
            puVar14 = puVar7 + 2;
            if (local_90 == puVar14) {
              local_80 = *puVar14;
              lStack_78 = puVar7[3];
              local_90 = &local_80;
            }
            else {
              local_80 = *puVar14;
            }
            local_88 = puVar7[1];
            *puVar7 = puVar14;
            puVar7[1] = 0;
            *(undefined1 *)(puVar7 + 2) = 0;
            puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar7;
            psVar15 = puVar7 + 2;
            if (paVar16 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar15) goto LAB_00125d06;
            local_b0.field_2._M_allocated_capacity = *psVar15;
            local_b0.field_2._8_8_ = puVar7[3];
            goto LAB_00125d17;
          }
          iVar4 = clone(ExecDeathTestChildMain,(void *)(lVar17 + (long)__addr),0x11,
                        (void *)((long)&internal_flag.field_2 + 8));
          iVar5 = munmap(__addr,__len);
          if (iVar5 != -1) goto LAB_00124446;
          local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_f0,"CHECK failed: File ","");
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
          local_d0._M_dataplus._M_p = (pointer)*puVar7;
          puVar14 = puVar7 + 2;
          if ((ulong *)local_d0._M_dataplus._M_p == puVar14) {
            local_d0.field_2._M_allocated_capacity = *puVar14;
            local_d0.field_2._8_8_ = puVar7[3];
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          }
          else {
            local_d0.field_2._M_allocated_capacity = *puVar14;
          }
          local_d0._M_string_length = puVar7[1];
          *puVar7 = puVar14;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
          local_70 = (ulong *)*puVar7;
          puVar14 = puVar7 + 2;
          if (local_70 == puVar14) {
            local_60 = *puVar14;
            lStack_58 = puVar7[3];
            local_70 = &local_60;
          }
          else {
            local_60 = *puVar14;
          }
          local_68 = puVar7[1];
          *puVar7 = puVar14;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          pipe_fd[0] = 0x564;
          StreamableToString<int>(&local_110,pipe_fd);
          uVar21 = 0xf;
          if (local_70 != &local_60) {
            uVar21 = local_60;
          }
          if (uVar21 < local_110._M_string_length + local_68) {
            uVar22 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              uVar22 = local_110.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar22 < local_110._M_string_length + local_68) goto LAB_0012561c;
            puVar7 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_70);
          }
          else {
LAB_0012561c:
            puVar7 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_70,(ulong)local_110._M_dataplus._M_p);
          }
          local_50 = (pointer *)*puVar7;
          pppcVar9 = (pointer *)(puVar7 + 2);
          if (local_50 == pppcVar9) {
            local_40 = *pppcVar9;
            lStack_38 = puVar7[3];
            local_50 = &local_40;
          }
          else {
            local_40 = *pppcVar9;
          }
          local_48 = puVar7[1];
          *puVar7 = pppcVar9;
          puVar7[1] = 0;
          *(undefined1 *)pppcVar9 = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
          local_90 = (ulong *)*puVar7;
          puVar14 = puVar7 + 2;
          if (local_90 == puVar14) {
            local_80 = *puVar14;
            lStack_78 = puVar7[3];
            local_90 = &local_80;
          }
          else {
            local_80 = *puVar14;
          }
          local_88 = puVar7[1];
          *puVar7 = puVar14;
          puVar7[1] = 0;
          *(undefined1 *)(puVar7 + 2) = 0;
          puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar7;
          psVar15 = puVar7 + 2;
          if (paVar16 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar15) goto LAB_00125d3a;
          local_b0.field_2._M_allocated_capacity = *psVar15;
          local_b0.field_2._8_8_ = puVar7[3];
          goto LAB_00125d4b;
        }
        piVar8 = __errno_location();
      } while (*piVar8 == 4);
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"CHECK failed: File ","")
      ;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_110);
      local_f0._M_dataplus._M_p = (pointer)*plVar6;
      plVar11 = plVar6 + 2;
      if ((long *)local_f0._M_dataplus._M_p == plVar11) {
        local_f0.field_2._M_allocated_capacity = *plVar11;
        local_f0.field_2._8_8_ = plVar6[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *plVar11;
      }
      local_f0._M_string_length = plVar6[1];
      *plVar6 = (long)plVar11;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_d0._M_dataplus._M_p = (pointer)*plVar6;
      puVar14 = (ulong *)(plVar6 + 2);
      if ((ulong *)local_d0._M_dataplus._M_p == puVar14) {
        local_d0.field_2._M_allocated_capacity = *puVar14;
        local_d0.field_2._8_8_ = plVar6[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *puVar14;
      }
      local_d0._M_string_length = plVar6[1];
      *plVar6 = (long)puVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      local_1c0._M_dataplus._M_p._0_4_ = 0x546;
      StreamableToString<int>((string *)pipe_fd,(int *)&local_1c0);
      uVar22 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        uVar22 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar22 < local_128 + local_d0._M_string_length) {
        uVar22 = 0xf;
        if (pipe_fd != (int  [2])&local_120) {
          uVar22 = local_120._M_allocated_capacity;
        }
        if ((ulong)uVar22 < local_128 + local_d0._M_string_length) goto LAB_001247a6;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)pipe_fd,0,(char *)0x0,(ulong)local_d0._M_dataplus._M_p);
      }
      else {
LAB_001247a6:
        puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)pipe_fd);
      }
      local_70 = (ulong *)*puVar7;
      puVar14 = puVar7 + 2;
      if (local_70 == puVar14) {
        local_60 = *puVar14;
        lStack_58 = puVar7[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *puVar14;
      }
      local_68 = puVar7[1];
      *puVar7 = puVar14;
      puVar7[1] = 0;
      *(undefined1 *)puVar14 = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      local_50 = (pointer *)*puVar7;
      pppcVar9 = (pointer *)(puVar7 + 2);
      if (local_50 == pppcVar9) {
        local_40 = *pppcVar9;
        lStack_38 = puVar7[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *pppcVar9;
      }
      local_48 = puVar7[1];
      *puVar7 = pppcVar9;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
      local_90 = (ulong *)*puVar7;
      puVar14 = puVar7 + 2;
      if (local_90 == puVar14) {
        local_80 = *puVar14;
        lStack_78 = puVar7[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *puVar14;
      }
      local_88 = puVar7[1];
      *puVar7 = puVar14;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
      local_b0._M_dataplus._M_p = (pointer)*puVar7;
      puVar13 = puVar7 + 2;
      if ((ulong *)local_b0._M_dataplus._M_p == puVar13) {
        local_b0.field_2._M_allocated_capacity = *puVar13;
        local_b0.field_2._8_8_ = puVar7[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *puVar13;
      }
      local_b0._M_string_length = puVar7[1];
      *puVar7 = puVar13;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      DeathTestAbort(&local_b0);
      puVar7 = extraout_RAX;
      paVar16 = extraout_RDX;
      goto LAB_001253f1;
    }
    local_70 = &local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CHECK failed: File ","");
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
    local_50 = (pointer *)*puVar7;
    pppcVar9 = (pointer *)(puVar7 + 2);
    if (local_50 == pppcVar9) {
      local_40 = *pppcVar9;
      lStack_38 = puVar7[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *pppcVar9;
    }
    local_48 = puVar7[1];
    *puVar7 = pppcVar9;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (ulong *)*puVar7;
    puVar14 = puVar7 + 2;
    if (local_90 == puVar14) {
      local_80 = *puVar14;
      lStack_78 = puVar7[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *puVar14;
    }
    local_88 = puVar7[1];
    *puVar7 = puVar14;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    local_f0._M_dataplus._M_p._0_4_ = 0x58c;
    StreamableToString<int>(&local_d0,(int *)&local_f0);
    uVar21 = 0xf;
    if (local_90 != &local_80) {
      uVar21 = local_80;
    }
    if (uVar21 < local_d0._M_string_length + local_88) {
      uVar22 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        uVar22 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar22 < local_d0._M_string_length + local_88) goto LAB_001251e2;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_90);
    }
    else {
LAB_001251e2:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_d0._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pointer)*puVar7;
    puVar14 = puVar7 + 2;
    if ((ulong *)local_b0._M_dataplus._M_p == puVar14) {
      local_b0.field_2._M_allocated_capacity = *puVar14;
      local_b0.field_2._8_8_ = puVar7[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *puVar14;
    }
    local_b0._M_string_length = puVar7[1];
    *puVar7 = puVar14;
    puVar7[1] = 0;
    *(undefined1 *)puVar14 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_310.sa_handler = (__sighandler_t)*plVar6;
    p_Var10 = (__sighandler_t)(plVar6 + 2);
    if (local_310.sa_handler == p_Var10) {
      ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var10;
      ignore_sigprof_action.sa_mask.__val[1] = plVar6[3];
      local_310 = (_union_1457)&ignore_sigprof_action.sa_mask;
    }
    else {
      ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var10;
    }
    ignore_sigprof_action.__sigaction_handler =
         *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar6 + 1);
    *plVar6 = (long)p_Var10;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
    filter_flag.field_2._8_8_ = *puVar7;
    puVar14 = puVar7 + 2;
    if ((ulong *)filter_flag.field_2._8_8_ != puVar14) goto LAB_00125b29;
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar14;
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar7[3];
    filter_flag.field_2._8_8_ =
         &args_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  }
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar7[1];
  *puVar7 = puVar14;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  DeathTestAbort((string *)((long)&filter_flag.field_2 + 8));
  puVar7 = extraout_RAX_03;
  local_90 = extraout_RDX_03;
  goto LAB_00125b5d;
LAB_001244df:
  do {
    iVar5 = close(local_134);
    if (iVar5 != -1) {
      *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = iVar4;
      (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_138;
      (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
      Arguments::~Arguments((Arguments *)auStack_158);
      if (local_1a0 != &internal_flag._M_string_length) {
        operator_delete(local_1a0,internal_flag._M_string_length + 1);
      }
      if (ignore_sigprof_action.sa_restorer != (_func_void *)&filter_flag._M_string_length) {
        operator_delete(ignore_sigprof_action.sa_restorer,filter_flag._M_string_length + 1);
      }
      return OVERSEE_TEST;
    }
    piVar8 = __errno_location();
  } while (*piVar8 == 4);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"CHECK failed: File ","");
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
  local_70 = (ulong *)*puVar7;
  puVar14 = puVar7 + 2;
  if (local_70 == puVar14) {
    local_60 = *puVar14;
    lStack_58 = puVar7[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar14;
  }
  local_68 = puVar7[1];
  *puVar7 = puVar14;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_50 = (pointer *)*plVar6;
  pppcVar9 = (pointer *)(plVar6 + 2);
  if (local_50 == pppcVar9) {
    local_40 = *pppcVar9;
    lStack_38 = plVar6[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *pppcVar9;
  }
  local_48 = plVar6[1];
  *plVar6 = (long)pppcVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_110._M_dataplus._M_p._0_4_ = 0x5a3;
  StreamableToString<int>(&local_f0,(int *)&local_110);
  ppcVar20 = (pointer)0xf;
  if (local_50 != &local_40) {
    ppcVar20 = local_40;
  }
  if (ppcVar20 < (pointer)(local_f0._M_string_length + local_48)) {
    uVar22 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar22 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar22 < (pointer)(local_f0._M_string_length + local_48)) goto LAB_001248f7;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_50);
  }
  else {
LAB_001248f7:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_f0._M_dataplus._M_p);
  }
  local_90 = (ulong *)*puVar7;
  puVar14 = puVar7 + 2;
  if (local_90 == puVar14) {
    local_80 = *puVar14;
    lStack_78 = puVar7[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar14;
  }
  local_88 = puVar7[1];
  *puVar7 = puVar14;
  puVar7[1] = 0;
  *(undefined1 *)puVar14 = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
  local_b0._M_dataplus._M_p = (pointer)*puVar7;
  puVar14 = puVar7 + 2;
  if ((ulong *)local_b0._M_dataplus._M_p == puVar14) {
    local_b0.field_2._M_allocated_capacity = *puVar14;
    local_b0.field_2._8_8_ = puVar7[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *puVar14;
  }
  local_b0._M_string_length = puVar7[1];
  *puVar7 = puVar14;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_310.sa_handler = (__sighandler_t)*plVar6;
  p_Var10 = (__sighandler_t)(plVar6 + 2);
  if (local_310.sa_handler == p_Var10) {
    ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var10;
    ignore_sigprof_action.sa_mask.__val[1] = plVar6[3];
    local_310 = (_union_1457)&ignore_sigprof_action.sa_mask;
  }
  else {
    ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var10;
  }
  ignore_sigprof_action.__sigaction_handler =
       *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar6 + 1);
  *plVar6 = (long)p_Var10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
  filter_flag.field_2._8_8_ = *puVar7;
  puVar13 = puVar7 + 2;
  if ((ulong *)filter_flag.field_2._8_8_ != puVar13) goto LAB_00125425;
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar13;
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar7[3];
  filter_flag.field_2._8_8_ = ppbVar1;
  goto LAB_00125436;
  while (piVar8 = __errno_location(), *piVar8 == 4) {
LAB_0012444d:
    iVar5 = sigaction(0x1b,(sigaction *)((long)&filter_flag.field_2 + 8),(sigaction *)0x0);
    if (iVar5 != -1) {
      if (iVar4 != -1) goto LAB_001244df;
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"CHECK failed: File ","");
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
      local_d0._M_dataplus._M_p = (pointer)*puVar7;
      puVar14 = puVar7 + 2;
      if ((ulong *)local_d0._M_dataplus._M_p == puVar14) {
        local_d0.field_2._M_allocated_capacity = *puVar14;
        local_d0.field_2._8_8_ = puVar7[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *puVar14;
      }
      local_d0._M_string_length = puVar7[1];
      *puVar7 = puVar14;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
      local_70 = (ulong *)*puVar7;
      puVar14 = puVar7 + 2;
      if (local_70 == puVar14) {
        local_60 = *puVar14;
        lStack_58 = puVar7[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *puVar14;
      }
      local_68 = puVar7[1];
      *puVar7 = puVar14;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      pipe_fd[0] = 0x574;
      StreamableToString<int>(&local_110,pipe_fd);
      uVar21 = 0xf;
      if (local_70 != &local_60) {
        uVar21 = local_60;
      }
      if (uVar21 < local_110._M_string_length + local_68) {
        uVar22 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          uVar22 = local_110.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar22 < local_110._M_string_length + local_68) goto LAB_001253af;
        puVar7 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_70);
      }
      else {
LAB_001253af:
        puVar7 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_70,(ulong)local_110._M_dataplus._M_p);
      }
      local_50 = (pointer *)*puVar7;
      pppcVar9 = (pointer *)(puVar7 + 2);
      if (local_50 == pppcVar9) {
        local_40 = *pppcVar9;
        lStack_38 = puVar7[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *pppcVar9;
      }
      local_48 = puVar7[1];
      *puVar7 = pppcVar9;
      puVar7[1] = 0;
      *(undefined1 *)pppcVar9 = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_90 = (ulong *)*plVar6;
      puVar14 = (ulong *)(plVar6 + 2);
      if (local_90 == puVar14) {
        local_80 = *puVar14;
        lStack_78 = plVar6[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *puVar14;
      }
      local_88 = plVar6[1];
      *plVar6 = (long)puVar14;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_b0._M_dataplus._M_p = (pointer)*plVar6;
      psVar15 = (size_type *)(plVar6 + 2);
      if ((size_type *)local_b0._M_dataplus._M_p == psVar15) {
        local_b0.field_2._M_allocated_capacity = *psVar15;
        local_b0.field_2._8_8_ = plVar6[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar15;
      }
      local_b0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar15;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      DeathTestAbort(&local_b0);
      puVar7 = extraout_RAX_04;
      local_b0._M_dataplus._M_p = (pointer)extraout_RDX_04;
      goto LAB_00125cd2;
    }
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"CHECK failed: File ","");
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
  local_f0._M_dataplus._M_p = (pointer)*puVar7;
  plVar6 = puVar7 + 2;
  if ((long *)local_f0._M_dataplus._M_p == plVar6) {
    local_f0.field_2._M_allocated_capacity = *plVar6;
    local_f0.field_2._8_8_ = puVar7[3];
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  }
  else {
    local_f0.field_2._M_allocated_capacity = *plVar6;
  }
  local_f0._M_string_length = puVar7[1];
  *puVar7 = plVar6;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
  local_d0._M_dataplus._M_p = (pointer)*puVar7;
  puVar14 = puVar7 + 2;
  if ((ulong *)local_d0._M_dataplus._M_p == puVar14) {
    local_d0.field_2._M_allocated_capacity = *puVar14;
    local_d0.field_2._8_8_ = puVar7[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *puVar14;
  }
  local_d0._M_string_length = puVar7[1];
  *puVar7 = puVar14;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  local_1c0._M_dataplus._M_p._0_4_ = 0x571;
  StreamableToString<int>((string *)pipe_fd,(int *)&local_1c0);
  uVar22 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    uVar22 = local_d0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar22 < local_128 + local_d0._M_string_length) {
    uVar22 = 0xf;
    if (pipe_fd != (int  [2])&local_120) {
      uVar22 = local_120._M_allocated_capacity;
    }
    if ((ulong)uVar22 < local_128 + local_d0._M_string_length) goto LAB_00124859;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)pipe_fd,0,(char *)0x0,(ulong)local_d0._M_dataplus._M_p);
  }
  else {
LAB_00124859:
    puVar7 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)pipe_fd);
  }
  local_70 = (ulong *)*puVar7;
  puVar14 = puVar7 + 2;
  if (local_70 == puVar14) {
    local_60 = *puVar14;
    lStack_58 = puVar7[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar14;
  }
  local_68 = puVar7[1];
  *puVar7 = puVar14;
  puVar7[1] = 0;
  *(undefined1 *)puVar14 = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
  local_50 = (pointer *)*puVar7;
  pppcVar9 = (pointer *)(puVar7 + 2);
  if (local_50 == pppcVar9) {
    local_40 = *pppcVar9;
    lStack_38 = puVar7[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *pppcVar9;
  }
  local_48 = puVar7[1];
  *puVar7 = pppcVar9;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
  local_90 = (ulong *)*puVar7;
  puVar14 = puVar7 + 2;
  if (local_90 == puVar14) {
    local_80 = *puVar14;
    lStack_78 = puVar7[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar14;
  }
  local_88 = puVar7[1];
  *puVar7 = puVar14;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar7;
  puVar13 = puVar7 + 2;
  if (paVar16 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar13) {
    local_b0.field_2._M_allocated_capacity = *puVar13;
    local_b0.field_2._8_8_ = puVar7[3];
  }
  else {
LAB_001253f1:
    local_b0.field_2._M_allocated_capacity = *puVar13;
    local_b0._M_dataplus._M_p = (pointer)paVar16;
  }
  local_b0._M_string_length = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  DeathTestAbort(&local_b0);
  puVar7 = extraout_RAX_00;
  filter_flag.field_2._8_8_ = extraout_RDX_00;
LAB_00125425:
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar13;
LAB_00125436:
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  DeathTestAbort((string *)((long)&filter_flag.field_2 + 8));
  puVar7 = extraout_RAX_01;
  puVar14 = extraout_RDX_01;
LAB_00125459:
  local_60 = *puVar13;
  local_70 = puVar14;
LAB_00125464:
  local_68 = puVar7[1];
  *puVar7 = puVar13;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  pipe_fd[0] = 0x552;
  StreamableToString<int>(&local_110,pipe_fd);
  uVar21 = 0xf;
  if (local_70 != &local_60) {
    uVar21 = local_60;
  }
  if (uVar21 < local_110._M_string_length + local_68) {
    uVar22 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      uVar22 = local_110.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar22 < local_110._M_string_length + local_68) goto LAB_001254e6;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_001254e6:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_110._M_dataplus._M_p);
  }
  local_50 = (pointer *)*puVar7;
  pppcVar9 = (pointer *)(puVar7 + 2);
  if (local_50 == pppcVar9) {
    local_40 = *pppcVar9;
    lStack_38 = puVar7[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *pppcVar9;
  }
  local_48 = puVar7[1];
  *puVar7 = pppcVar9;
  puVar7[1] = 0;
  *(undefined1 *)pppcVar9 = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
  local_90 = (ulong *)*puVar7;
  puVar14 = puVar7 + 2;
  if (local_90 == puVar14) {
    local_80 = *puVar14;
    lStack_78 = puVar7[3];
    local_90 = &local_80;
  }
  else {
LAB_00125b5d:
    local_80 = *puVar14;
  }
  local_88 = puVar7[1];
  *puVar7 = puVar14;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
  local_b0._M_dataplus._M_p = (pointer)*puVar7;
  psVar15 = puVar7 + 2;
  if ((size_type *)local_b0._M_dataplus._M_p == psVar15) {
    local_b0.field_2._M_allocated_capacity = *psVar15;
    local_b0.field_2._8_8_ = puVar7[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
LAB_00125cd2:
    local_b0.field_2._M_allocated_capacity = *psVar15;
  }
  local_b0._M_string_length = puVar7[1];
  *puVar7 = psVar15;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  DeathTestAbort(&local_b0);
  puVar7 = extraout_RAX_05;
  paVar16 = extraout_RDX_05;
LAB_00125d06:
  local_b0.field_2._M_allocated_capacity = *psVar15;
  local_b0._M_dataplus._M_p = (pointer)paVar16;
LAB_00125d17:
  local_b0._M_string_length = puVar7[1];
  *puVar7 = psVar15;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  DeathTestAbort(&local_b0);
  puVar7 = extraout_RAX_06;
  paVar16 = extraout_RDX_06;
LAB_00125d3a:
  local_b0.field_2._M_allocated_capacity = *psVar15;
  local_b0._M_dataplus._M_p = (pointer)paVar16;
LAB_00125d4b:
  local_b0._M_string_length = puVar7[1];
  *puVar7 = psVar15;
  puVar7[1] = 0;
  *(undefined1 *)(puVar7 + 2) = 0;
  DeathTestAbort(&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,(long)local_40 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  Arguments::~Arguments((Arguments *)auStack_158);
  if (local_1a0 != &internal_flag._M_string_length) {
    operator_delete(local_1a0,internal_flag._M_string_length + 1);
  }
  if (ignore_sigprof_action.sa_restorer != (_func_void *)&filter_flag._M_string_length) {
    operator_delete(ignore_sigprof_action.sa_restorer,filter_flag._M_string_length + 1);
  }
  _Unwind_Resume(extraout_RAX_07);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  kFilterFlag + "=" + info->test_suite_name() +
                                  "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}